

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O3

string_view __thiscall absl::lts_20250127::StripAsciiWhitespace(lts_20250127 *this,string_view str)

{
  lts_20250127 *plVar1;
  ulong uVar2;
  long lVar3;
  lts_20250127 *plVar4;
  lts_20250127 *plVar5;
  lts_20250127 *plVar6;
  ulong uVar7;
  string_view sVar8;
  
  plVar4 = (lts_20250127 *)str._M_len;
  plVar5 = this + (long)plVar4;
  plVar1 = plVar4;
  if (0 < (long)this >> 2) {
    plVar1 = plVar4 + ((ulong)this & 0xfffffffffffffffc);
    lVar3 = ((long)this >> 2) + 1;
    plVar6 = plVar4 + 3;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)plVar6[-3]] & 8) == 0) {
        plVar6 = plVar6 + -3;
        goto LAB_00326325;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)plVar6[-2]] & 8) == 0) {
        plVar6 = plVar6 + -2;
        goto LAB_00326325;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)plVar6[-1]] & 8) == 0) {
        plVar6 = plVar6 + -1;
        goto LAB_00326325;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)*plVar6] & 8) == 0) goto LAB_00326325;
      lVar3 = lVar3 + -1;
      plVar6 = plVar6 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)plVar5 - (long)plVar1;
  if (lVar3 == 1) {
LAB_0032630e:
    plVar6 = plVar1;
    if (((&ascii_internal::kPropertyBits)[(byte)*plVar1] & 8) != 0) {
      plVar6 = plVar5;
    }
  }
  else if (lVar3 == 2) {
LAB_003262e4:
    plVar6 = plVar1;
    if (((&ascii_internal::kPropertyBits)[(byte)*plVar1] & 8) != 0) {
      plVar1 = plVar1 + 1;
      goto LAB_0032630e;
    }
  }
  else {
    plVar6 = plVar5;
    if ((lVar3 == 3) &&
       (plVar6 = plVar1, ((&ascii_internal::kPropertyBits)[(byte)*plVar1] & 8) != 0)) {
      plVar1 = plVar1 + 1;
      goto LAB_003262e4;
    }
  }
LAB_00326325:
  plVar1 = plVar6 + -(long)plVar4;
  uVar7 = (long)this - (long)plVar1;
  if (this < plVar1) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  plVar4 = plVar4 + (long)plVar1;
  plVar1 = plVar5;
  if (0 < (long)uVar7 >> 2) {
    plVar1 = plVar4 + ((uint)uVar7 & 3);
    lVar3 = ((long)uVar7 >> 2) + 1;
    do {
      if (((&ascii_internal::kPropertyBits)[(byte)plVar5[-1]] & 8) == 0) goto LAB_0032640d;
      if (((&ascii_internal::kPropertyBits)[(byte)plVar5[-2]] & 8) == 0) {
        plVar5 = plVar5 + -1;
        goto LAB_0032640d;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)plVar5[-3]] & 8) == 0) {
        plVar5 = plVar5 + -2;
        goto LAB_0032640d;
      }
      if (((&ascii_internal::kPropertyBits)[(byte)plVar5[-4]] & 8) == 0) {
        plVar5 = plVar5 + -3;
        goto LAB_0032640d;
      }
      plVar5 = plVar5 + -4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)plVar1 - (long)plVar6;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      plVar5 = plVar4;
      if ((lVar3 != 3) ||
         (plVar5 = plVar1, ((&ascii_internal::kPropertyBits)[(byte)plVar1[-1]] & 8) == 0))
      goto LAB_0032640d;
      plVar1 = plVar1 + -1;
    }
    plVar5 = plVar1;
    if (((&ascii_internal::kPropertyBits)[(byte)plVar1[-1]] & 8) == 0) goto LAB_0032640d;
    plVar1 = plVar1 + -1;
  }
  plVar5 = plVar1;
  if (((&ascii_internal::kPropertyBits)[(byte)plVar1[-1]] & 8) != 0) {
    plVar5 = plVar4;
  }
LAB_0032640d:
  uVar2 = (long)plVar5 - (long)plVar6;
  if (uVar7 < (ulong)((long)plVar5 - (long)plVar6)) {
    uVar2 = uVar7;
  }
  sVar8._M_str = (char *)plVar4;
  sVar8._M_len = uVar2;
  return sVar8;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripAsciiWhitespace(
    absl::string_view str) {
  return StripTrailingAsciiWhitespace(StripLeadingAsciiWhitespace(str));
}